

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

bool __thiscall cppcms::widgets::regex_field::validate(regex_field *this)

{
  bool bVar1;
  string *in_RDI;
  base_text *in_stack_ffffffffffffff88;
  base_widget *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 v;
  string local_30 [24];
  base_text *in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = base_text::validate(in_stack_ffffffffffffff88);
  if (bVar1) {
    this_00 = (base_widget *)(&in_RDI->_M_dataplus + *(long *)(*(long *)in_RDI + -0x18));
    bVar1 = base_widget::set((base_widget *)
                             (&in_RDI->_M_dataplus + *(long *)(*(long *)in_RDI + -0x18)));
    v = false;
    if (bVar1) {
      base_text::value_abi_cxx11_(in_stack_ffffffffffffffe8);
      v = booster::regex_match<booster::regex>
                    (in_RDI,(regex *)CONCAT17(v,in_stack_ffffffffffffffa8),
                     (int)((ulong)this_00 >> 0x20));
    }
    base_widget::valid(this_00,(bool)v);
    if (bVar1) {
      std::__cxx11::string::~string(local_30);
    }
    local_1 = base_widget::valid((base_widget *)
                                 (&in_RDI->_M_dataplus + *(long *)(*(long *)in_RDI + -0x18)));
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool regex_field::validate()
{
	if(!text::validate())
		return false;
	valid(set() && booster::regex_match(value(),expression_));
	return valid();
}